

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O1

void __thiscall
duckdb::WriteAheadLog::WriteCreateTable(WriteAheadLog *this,TableCatalogEntry *entry)

{
  BinarySerializer *this_00;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer local_5c0;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&local_5c0,this,CREATE_TABLE);
  this_00 = &local_5c0.serializer;
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"table");
  Serializer::WriteValue<duckdb::TableCatalogEntry>(&this_00->super_Serializer,entry);
  (*local_5c0.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&local_5c0.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&local_5c0);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateTable(const TableCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_TABLE);
	serializer.WriteProperty(101, "table", &entry);
	serializer.End();
}